

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * __thiscall pugi::impl::anon_unknown_0::gap::flush(gap *this,char_t *s)

{
  char_t *__src;
  
  __src = this->end;
  if (__src != (char_t *)0x0) {
    if (s < __src) {
      __assert_fail("s >= end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                    ,0x985,"char_t *pugi::impl::(anonymous namespace)::gap::flush(char_t *)");
    }
    memmove(__src + -this->size,__src,(long)s - (long)__src);
    s = s + -this->size;
  }
  return s;
}

Assistant:

char_t* flush(char_t* s)
		{
			if (end)
			{
				// Move [old_gap_end, current_pos) to [old_gap_start, ...)
				assert(s >= end);
				memmove(end - size, end, reinterpret_cast<char*>(s) - reinterpret_cast<char*>(end));

				return s - size;
			}
			else return s;
		}